

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O1

void __thiscall glslang::TPpContext::pushInput(TPpContext *this,tInput *in)

{
  pointer *ppptVar1;
  iterator __position;
  tInput *local_8;
  
  __position._M_current =
       (this->inputStack).
       super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_8 = in;
  if (__position._M_current ==
      (this->inputStack).
      super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<glslang::TPpContext::tInput*,std::allocator<glslang::TPpContext::tInput*>>::
    _M_realloc_insert<glslang::TPpContext::tInput*const&>
              ((vector<glslang::TPpContext::tInput*,std::allocator<glslang::TPpContext::tInput*>> *)
               &this->inputStack,__position,&local_8);
  }
  else {
    *__position._M_current = in;
    ppptVar1 = &(this->inputStack).
                super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *ppptVar1 = *ppptVar1 + 1;
  }
  (*local_8->_vptr_tInput[10])();
  return;
}

Assistant:

void pushInput(tInput* in)
    {
        inputStack.push_back(in);
        in->notifyActivated();
    }